

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O0

bool __thiscall QUndoStack::isActive(QUndoStack *this)

{
  QUndoStackPrivate *pQVar1;
  QUndoStack *pQVar2;
  QUndoGroup *in_RDI;
  QUndoStackPrivate *d;
  bool local_11;
  
  pQVar1 = d_func((QUndoStack *)0xa843dc);
  local_11 = true;
  if (pQVar1->group != (QUndoGroup *)0x0) {
    pQVar2 = QUndoGroup::activeStack(in_RDI);
    local_11 = pQVar2 == (QUndoStack *)in_RDI;
  }
  return local_11;
}

Assistant:

bool QUndoStack::isActive() const
{
#if !QT_CONFIG(undogroup)
    return true;
#else
    Q_D(const QUndoStack);
    return d->group == nullptr || d->group->activeStack() == this;
#endif
}